

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

void mqtt_init_reconnect(mqtt_client *client,_func_void_mqtt_client_ptr_void_ptr_ptr *reconnect,
                        void *reconnect_state,
                        _func_void_void_ptr_ptr_mqtt_response_publish_ptr *publish_response_callback
                        )

{
  pthread_mutex_init((pthread_mutex_t *)&client->mutex,(pthread_mutexattr_t *)0x0);
  client->socketfd = -1;
  (client->recv_buffer).mem_start = (uint8_t *)0x0;
  (client->recv_buffer).mem_size = 0;
  (client->recv_buffer).curr = (uint8_t *)0x0;
  (client->recv_buffer).curr_sz = 0;
  (client->mq).mem_start = (void *)0x0;
  (client->mq).mem_end = (void *)0x0;
  (client->mq).curr = (uint8_t *)0x0;
  (client->mq).curr_sz = 0;
  (client->mq).queue_tail = (mqtt_queued_message *)0x0;
  client->error = MQTT_ERROR_INITIAL_RECONNECT;
  client->response_timeout = 0x1e;
  client->number_of_timeouts = 0;
  client->typical_response_time = -1.0;
  client->number_of_keep_alives = 0;
  client->publish_response_callback = publish_response_callback;
  client->pid_lfsr = 0;
  client->send_offset = 0;
  client->inspector_callback = (_func_MQTTErrors_mqtt_client_ptr *)0x0;
  client->reconnect_callback = reconnect;
  client->reconnect_state = reconnect_state;
  return;
}

Assistant:

void mqtt_init_reconnect(struct mqtt_client *client,
                         void (*reconnect)(struct mqtt_client *, void**),
                         void *reconnect_state,
                         void (*publish_response_callback)(void** state, struct mqtt_response_publish *publish))
{
    /* initialize mutex */
    MQTT_PAL_MUTEX_INIT(&client->mutex);

    client->socketfd = (mqtt_pal_socket_handle) -1;

    mqtt_mq_init(&client->mq, NULL, 0uL);

    client->recv_buffer.mem_start = NULL;
    client->recv_buffer.mem_size = 0;
    client->recv_buffer.curr = NULL;
    client->recv_buffer.curr_sz = 0;

    client->error = MQTT_ERROR_INITIAL_RECONNECT;
    client->response_timeout = 30;
    client->number_of_timeouts = 0;
    client->number_of_keep_alives = 0;
    client->typical_response_time = -1.0f;
    client->publish_response_callback = publish_response_callback;
    client->pid_lfsr = 0;
    client->send_offset = 0;

    client->inspector_callback = NULL;
    client->reconnect_callback = reconnect;
    client->reconnect_state = reconnect_state;
}